

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

StructurePtr __thiscall soul::Module::Structs::find(Structs *this,string_view name)

{
  bool bVar1;
  Structure *pSVar2;
  char *in_RCX;
  RefCountedPtr<soul::Structure> *this_00;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  this_00 = *(RefCountedPtr<soul::Structure> **)name._M_len;
  lVar3 = ((undefined8 *)name._M_len)[1] << 3;
  while( true ) {
    if (lVar3 == 0) {
      (this->structs).items = (RefCountedPtr<soul::Structure> *)0x0;
      return (StructurePtr)(Structure *)this;
    }
    pSVar2 = RefCountedPtr<soul::Structure>::operator->(this_00);
    __x._M_str = in_RCX;
    __x._M_len = (size_t)name._M_str;
    __y._M_str = (pSVar2->name)._M_dataplus._M_p;
    __y._M_len = (pSVar2->name)._M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    this_00 = this_00 + 1;
    lVar3 = lVar3 + -8;
  }
  pSVar2 = this_00->object;
  (this->structs).items = (RefCountedPtr<soul::Structure> *)pSVar2;
  if (pSVar2 == (Structure *)0x0) {
    return (StructurePtr)(Structure *)this;
  }
  (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr Module::Structs::find (std::string_view name) const noexcept
{
    for (auto& s : structs)
        if (name == s->getName())
            return s;

    return {};
}